

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-command.c
# Opt level: O2

void html_screenshot(char *path,wchar_t mode,term_conflict *other_term)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  int iVar9;
  wchar_t wVar10;
  char *s;
  ulong uVar11;
  wchar_t wVar12;
  wchar_t y;
  char *pcVar13;
  wchar_t x;
  int iVar14;
  wchar_t y_00;
  ulong uVar15;
  ang_file *f;
  wchar_t c;
  wchar_t a;
  wchar_t local_90;
  wchar_t other_wid;
  wchar_t local_88;
  wchar_t other_hgt;
  wchar_t main_hgt;
  wchar_t main_wid;
  ang_file *local_78;
  ulong local_70;
  wchar_t local_64;
  uint local_60;
  int local_5c;
  wchar_t local_58;
  wchar_t local_54;
  term *local_50;
  term_conflict *local_48;
  char *local_40;
  char *local_38;
  
  a = L'\x01';
  c = L' ';
  local_50 = Term;
  local_40 = "[/COLOR][COLOR=\"#%02X%02X%02X\"]";
  if (mode == L'\0') {
    local_40 = "</font><font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">";
  }
  wVar8 = text_wcsz();
  s = (char *)mem_alloc((long)(wVar8 + L'\x01'));
  local_78 = file_open(path,MODE_WRITE,FTYPE_TEXT);
  if (local_78 == (ang_file *)0x0) {
    mem_free(s);
    plog_fmt("Cannot write the \'%s\' file!",path);
    return;
  }
  Term_get_size(&main_wid,&main_hgt);
  if (other_term == (term_conflict *)0x0) {
    other_wid = L'\0';
    other_hgt = L'\0';
  }
  else {
    Term_activate((term *)other_term);
    Term_get_size(&other_wid,&other_hgt);
    Term_activate(local_50);
  }
  f = local_78;
  local_70 = (ulong)(uint)main_wid;
  wVar8 = other_hgt;
  if (other_hgt < main_hgt) {
    wVar8 = main_hgt;
  }
  local_88 = main_wid + L'\x01' + other_wid;
  if (other_wid < L'\x01') {
    local_88 = main_wid;
  }
  local_90 = mode;
  local_48 = other_term;
  if (mode == L'\0') {
    file_putf(local_78,"<!DOCTYPE html><html><head>\n");
    file_putf(f,"  <meta http-equiv=\'Content-Type\' content=\'text/html; charset=utf-8\'>\n");
    file_putf(f,"  <meta name=\'generator\' content=\'%s\'>\n",buildid);
    file_putf(f,"  <title>%s</title>\n",path);
    file_putf(f,"</head>\n\n");
    uVar11 = (ulong)angband_color_table[0][2];
    uVar15 = (ulong)angband_color_table[0][3];
    file_putf(f,"<body style=\'color: #%02X%02X%02X; background: #%02X%02X%02X;\'>\n",
              (ulong)angband_color_table[1][1],(ulong)angband_color_table[1][2],
              (ulong)angband_color_table[1][3],(ulong)angband_color_table[0][1]);
    file_putf(f,"<pre>\n",uVar15,uVar11);
  }
  else {
    file_putf(local_78,"[CODE][TT][BC=\"#%02X%02X%02X\"][COLOR=\"#%02X%02X%02X\"]\n",
              (ulong)angband_color_table[0][1],(ulong)angband_color_table[0][2],
              (ulong)angband_color_table[0][3],(ulong)angband_color_table[1][1],
              (ulong)angband_color_table[1][2],(ulong)angband_color_table[1][3]);
  }
  local_5c = (uint)local_70 + 1;
  local_38 = s + 1;
  local_54 = L'\0';
  if (L'\0' < local_88) {
    local_54 = local_88;
  }
  local_64 = L'\0';
  if (L'\0' < wVar8) {
    local_64 = wVar8;
  }
  local_60 = ~(uint)local_70;
  uVar11 = 0;
  wVar12 = L'\x01';
  local_58 = wVar8;
  for (y_00 = L'\0'; y_00 != local_64; y_00 = y_00 + L'\x01') {
    for (wVar8 = L'\0'; local_54 != wVar8; wVar8 = wVar8 + L'\x01') {
      if ((wVar8 < main_wid) && (y_00 < main_hgt)) {
        iVar14 = Term->sidebar_mode;
        wVar10 = row_top_map[iVar14];
        y = y_00;
        x = wVar8;
        if ((((y_00 < wVar10) || (local_58 - row_bottom_map[iVar14] <= y_00)) ||
            (wVar7 = col_map[iVar14], wVar8 < wVar7)) ||
           ((x = (uint)tile_width * (wVar8 - wVar7) + wVar7, x < local_88 &&
            (y = (y_00 - wVar10) * (uint)tile_height + wVar10, y < local_58 - row_bottom_map[iVar14]
            )))) {
          Term_what(x,y,&a,&c);
          goto LAB_001c8525;
        }
LAB_001c861d:
        a = L'\x01';
        c = L' ';
        uVar15 = 0;
        iVar14 = 1;
      }
      else {
        if ((wVar8 <= (wchar_t)local_70) || ((other_wid + local_5c <= wVar8 || (other_hgt <= y_00)))
           ) goto LAB_001c861d;
        wVar10 = local_60 + wVar8;
        if (wVar10 == L'\0') {
          Term_activate((term *)local_48);
        }
        Term_what(wVar10,y_00,&a,&c);
        f = local_78;
        if (wVar8 == other_wid + (wchar_t)local_70) {
          Term_activate(local_50);
        }
LAB_001c8525:
        uVar15 = (long)a % 0x20 & 0xffffffff;
        iVar14 = (int)((long)a % 0x20);
        iVar9 = (int)((long)a / 0x100);
        if (iVar9 == 0) {
          uVar15 = (long)a / 0x100 & 0xffffffff;
        }
        else if (iVar9 == 2) {
          uVar15 = 0x1c;
        }
        else if ((iVar9 != 1) && (uVar15 = uVar11, 0x2ff < (uint)a)) {
          __assert_fail("(a >= 0) && (a < BG_MAX * MULT_BG)",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-command.c"
                        ,0x19d,"void html_screenshot(const char *, int, term *)");
        }
      }
      if (wVar12 == a) {
LAB_001c870b:
        wVar10 = c;
        if (local_90 != L'\0') goto LAB_001c8712;
        if (c != L'&') {
          if (c == L'>') {
            pcVar13 = "&gt;";
            goto LAB_001c8777;
          }
          if (c == L'<') {
            pcVar13 = "&lt;";
            goto LAB_001c8777;
          }
          wVar10 = text_wctomb(s,c);
          if (wVar10 < L'\x01') {
            *s = ' ';
            uVar11 = 1;
          }
          else {
            uVar11 = (ulong)(uint)wVar10;
          }
          s[uVar11] = '\0';
          goto LAB_001c874b;
        }
        pcVar13 = "&amp;";
LAB_001c8777:
        file_putf(f,pcVar13);
      }
      else {
        if (c != L' ' || local_90 == L'\0') {
          iVar9 = (int)uVar15;
          if ((local_90 == L'\0') && (wVar12 == L'\x01')) {
            bVar1 = angband_color_table[iVar14][1];
            bVar2 = angband_color_table[iVar14][2];
            bVar3 = angband_color_table[iVar14][3];
            bVar4 = angband_color_table[iVar9][1];
            bVar5 = angband_color_table[iVar9][2];
            bVar6 = angband_color_table[iVar9][3];
            pcVar13 = "<font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">";
          }
          else {
            if ((iVar9 == 0 && local_90 == L'\0') && iVar14 == 1) {
              file_putf(f,"%s","</font>");
              wVar12 = a;
              goto LAB_001c870b;
            }
            bVar1 = angband_color_table[iVar14][1];
            bVar2 = angband_color_table[iVar14][2];
            bVar3 = angband_color_table[iVar14][3];
            bVar4 = angband_color_table[iVar9][1];
            bVar5 = angband_color_table[iVar9][2];
            bVar6 = angband_color_table[iVar9][3];
            pcVar13 = local_40;
          }
          file_putf(f,pcVar13,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4,(ulong)bVar5,
                    (ulong)bVar6);
          wVar12 = a;
          goto LAB_001c870b;
        }
        wVar10 = L' ';
LAB_001c8712:
        wVar10 = text_wctomb(s,wVar10);
        if (wVar10 < L'\x01') {
          *s = ' ';
          pcVar13 = local_38;
        }
        else {
          pcVar13 = s + (uint)wVar10;
        }
        *pcVar13 = '\0';
LAB_001c874b:
        file_putf(f,"%s",s);
      }
      uVar11 = uVar15;
    }
    file_putf(f,"\n");
  }
  if ((local_90 == L'\0') && (wVar12 != L'\x01')) {
    file_putf(f,"%s","</font>");
  }
  else if (local_90 != L'\0') {
    pcVar13 = "[/COLOR][/BC][/TT][/CODE]\n";
    goto LAB_001c8818;
  }
  file_putf(f,"</pre>\n");
  file_putf(f,"</body>\n");
  pcVar13 = "</html>\n";
LAB_001c8818:
  file_putf(f,pcVar13);
  file_close(f);
  mem_free(s);
  return;
}

Assistant:

void html_screenshot(const char *path, int mode, term *other_term)
{
	/* Put the contents of the other terminal on the right by default. */
	bool other_left = false;
	int y, x;
	int main_wid, main_hgt, other_wid, other_hgt, wid, hgt;
	int main_xst, other_xst;
	int a = COLOUR_WHITE;
	int oa = COLOUR_WHITE;
	int fg_colour = COLOUR_WHITE;
	int bg_colour = COLOUR_DARK;
	wchar_t c = L' ';
	term *main_term = Term;

	const char *new_color_fmt = "<font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">";
	const char *change_color_fmt = (mode == 0) ?
					"</font><font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">"
					: "[/COLOR][COLOR=\"#%02X%02X%02X\"]";
	const char *close_color_str = "</font>";

	char *mbbuf;
	ang_file *fp;

	mbbuf = mem_alloc(text_wcsz() + 1);
	fp = file_open(path, MODE_WRITE, FTYPE_TEXT);

	/* Oops */
	if (!fp) {
		mem_free(mbbuf);
		plog_fmt("Cannot write the '%s' file!", path);
		return;
	}

	/* Retrieve current screen size */
	Term_get_size(&main_wid, &main_hgt);
	if (other_term) {
		Term_activate(other_term);
		Term_get_size(&other_wid, &other_hgt);
		Term_activate(main_term);
	} else {
		other_wid = 0;
		other_hgt = 0;
	}
	if (other_left) {
		other_xst = 0;
		main_xst = (other_wid > 0) ? other_wid + 1 : 0;
	} else {
		other_xst = main_wid + 1;
		main_xst = 0;
	}
	hgt = MAX(main_hgt, other_hgt);
	wid = (other_wid > 0) ? main_wid + other_wid + 1 : main_wid;

	if (mode == 0) {
		file_putf(fp, "<!DOCTYPE html><html><head>\n");
		file_putf(fp, "  <meta http-equiv='Content-Type' content='text/html; charset=utf-8'>\n");
		file_putf(fp, "  <meta name='generator' content='%s'>\n", buildid);
		file_putf(fp, "  <title>%s</title>\n", path);
		file_putf(fp, "</head>\n\n");
		file_putf(fp, "<body style='color: #%02X%02X%02X; background: #%02X%02X%02X;'>\n",
			angband_color_table[COLOUR_WHITE][1],
			angband_color_table[COLOUR_WHITE][2],
			angband_color_table[COLOUR_WHITE][3],
			angband_color_table[COLOUR_DARK][1],
			angband_color_table[COLOUR_DARK][2],
			angband_color_table[COLOUR_DARK][3]);
		file_putf(fp, "<pre>\n");
	} else {
		file_putf(fp, "[CODE][TT][BC=\"#%02X%02X%02X\"][COLOR=\"#%02X%02X%02X\"]\n",
			angband_color_table[COLOUR_DARK][1],
			angband_color_table[COLOUR_DARK][2],
			angband_color_table[COLOUR_DARK][3],
			angband_color_table[COLOUR_WHITE][1],
			angband_color_table[COLOUR_WHITE][2],
			angband_color_table[COLOUR_WHITE][3]);
	}

	/* Dump the screen */
	for (y = 0; y < hgt; y++) {
		for (x = 0; x < wid; x++) {
			/* Get the attr/char */
			if (x >= main_xst && x < main_xst + main_wid
					&& y < main_hgt) {
				screenshot_term_query(wid, hgt, x - main_xst, y,
					&a, &c);
			} else if (x >= other_xst && x < other_xst + other_wid
					&& y < other_hgt) {
				if (x == other_xst) {
					Term_activate(other_term);
				}
				Term_what(x - other_xst, y, &a, &c);
				if (x == other_xst + other_wid - 1) {
					Term_activate(main_term);
				}
			} else {
				a = COLOUR_WHITE;
				c = ' ';
			}

			/* Set the foreground and background */
			fg_colour = a % MAX_COLORS;
			switch (a / MULT_BG)
			{
				case BG_BLACK:
					bg_colour = COLOUR_DARK;
					break;
				case BG_SAME:
					bg_colour = fg_colour;
					break;
				case BG_DARK:
					bg_colour = COLOUR_SHADE;
					break;
				default:
					assert((a >= 0)
						&& (a < BG_MAX * MULT_BG));
			}

			/*
			 * Color change (for forum text, ignore changes if the character is
			 * a space since the forum software strips [COLOR][/COLOR] elements that
			 * only contain whitespace)
			 */
			if (oa != a && (mode == 0 || c != L' ')) {
				if (oa == COLOUR_WHITE && mode == 0) {
					/* From the default white to another color */
					file_putf(fp, new_color_fmt,
							  angband_color_table[fg_colour][1],
							  angband_color_table[fg_colour][2],
							  angband_color_table[fg_colour][3],
							  angband_color_table[bg_colour][1],
							  angband_color_table[bg_colour][2],
							  angband_color_table[bg_colour][3]);
				} else if (fg_colour == COLOUR_WHITE
						&& bg_colour == COLOUR_DARK
						&& mode == 0) {
					/* From another color to the default white */
					file_putf(fp, "%s", close_color_str);
				} else {
					/* Change colors */
					file_putf(fp, change_color_fmt,
							  angband_color_table[fg_colour][1],
							  angband_color_table[fg_colour][2],
							  angband_color_table[fg_colour][3],
							  angband_color_table[bg_colour][1],
							  angband_color_table[bg_colour][2],
							  angband_color_table[bg_colour][3]);
				}

				/* Remember the last color */
				oa = a;
			}

			/* Write the character and escape special HTML characters */
			if (mode == 0) write_html_escape_char(fp, mbbuf, c);
			else {
				int nc = text_wctomb(mbbuf, c);

				if (nc > 0) {
					mbbuf[nc] = 0;
				} else {
					mbbuf[0] = ' ';
					mbbuf[1] = 0;
				}
				file_putf(fp, "%s", mbbuf);
			}
		}

		/* End the row */
		file_putf(fp, "\n");
	}

	/* Close the last font-color tag if necessary */
	if (oa != COLOUR_WHITE && mode == 0) file_putf(fp, "%s", close_color_str);

	if (mode == 0) {
		file_putf(fp, "</pre>\n");
		file_putf(fp, "</body>\n");
		file_putf(fp, "</html>\n");
	} else {
		file_putf(fp, "[/COLOR][/BC][/TT][/CODE]\n");
	}

	/* Close it */
	file_close(fp);

	mem_free(mbbuf);
}